

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_rgb2gray(uchar *rgb,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  Mat *in_R8;
  undefined8 in_R9;
  int remain;
  int y;
  float *ptr;
  int wgap;
  uchar B2Y;
  uchar G2Y;
  uchar R2Y;
  uchar Y_shift;
  int local_48;
  int local_44;
  Mat *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  byte *local_10;
  int local_4;
  
  Mat::create((Mat *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int)((ulong)in_R8 >> 0x20),
              (int)in_R8,(int)((ulong)in_R9 >> 0x20),
              CONCAT17(8,CONCAT16(0x4d,CONCAT15(0x96,CONCAT14(0x1d,in_stack_ffffffffffffffc8)))),
              (Allocator *)in_stack_ffffffffffffffc0);
  bVar1 = Mat::empty(in_stack_ffffffffffffffc0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    iVar2 = in_ECX + in_ESI * -3;
    local_18 = in_EDX;
    local_14 = in_ESI;
    if (iVar2 == 0) {
      local_14 = in_ESI * in_EDX;
      local_18 = 1;
    }
    pfVar3 = Mat::operator_cast_to_float_(in_R8);
    local_10 = in_RDI;
    for (local_44 = 0; local_44 < local_18; local_44 = local_44 + 1) {
      for (local_48 = local_14; 0 < local_48; local_48 = local_48 + -1) {
        *pfVar3 = (float)((int)((uint)*local_10 * 0x4d + (uint)local_10[1] * 0x96 +
                               (uint)local_10[2] * 0x1d) >> 8);
        local_10 = local_10 + 3;
        pfVar3 = pfVar3 + 1;
      }
      local_10 = local_10 + iVar2;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int from_rgb2gray(const unsigned char* rgb, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    // coeffs for r g b = 0.299f, 0.587f, 0.114f
    const unsigned char Y_shift = 8; //14
    const unsigned char R2Y = 77;
    const unsigned char G2Y = 150;
    const unsigned char B2Y = 29;

    m.create(w, h, 1, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w * 3;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr = m;

    for (int y = 0; y < h; y++)
    {
#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        uint8x8_t _R2Y = vdup_n_u8(R2Y);
        uint8x8_t _G2Y = vdup_n_u8(G2Y);
        uint8x8_t _B2Y = vdup_n_u8(B2Y);
        for (; nn > 0; nn--)
        {
            uint8x8x3_t _rgb = vld3_u8(rgb);

            uint16x8_t _y16 = vmull_u8(_rgb.val[0], _R2Y);
            _y16 = vmlal_u8(_y16, _rgb.val[1], _G2Y);
            _y16 = vmlal_u8(_y16, _rgb.val[2], _B2Y);
            _y16 = vshrq_n_u16(_y16, Y_shift);

            float32x4_t _ylow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_y16)));
            float32x4_t _yhigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_y16)));

            vst1q_f32(ptr, _ylow);
            vst1q_f32(ptr + 4, _yhigh);

            rgb += 3 * 8;
            ptr += 8;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "vdup.u8    d16, %6             \n"
                "vdup.u8    d17, %7             \n"
                "vdup.u8    d18, %8             \n"
                "0:                             \n"
                "pld        [%1, #256]          \n"
                "vld3.u8    {d0-d2}, [%1]!      \n"
                "vmull.u8   q2, d0, d16         \n"
                "vmlal.u8   q2, d1, d17         \n"
                "vmlal.u8   q2, d2, d18         \n"
                "vshr.u16   q2, q2, #8          \n" // Y_shift
                "vmovl.u16  q0, d4              \n"
                "vmovl.u16  q1, d5              \n"
                "vcvt.f32.u32   q0, q0          \n"
                "vcvt.f32.u32   q1, q1          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d3}, [%2]!      \n"
                "bne        0b                  \n"
                : "=r"(nn),  // %0
                "=r"(rgb), // %1
                "=r"(ptr)  // %2
                : "0"(nn),
                "1"(rgb),
                "2"(ptr),
                "r"(R2Y), // %6
                "r"(G2Y), // %7
                "r"(B2Y)  // %8
                : "cc", "memory", "q0", "q1", "q2", "q8", "q9");
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            *ptr = static_cast<float>((rgb[0] * R2Y + rgb[1] * G2Y + rgb[2] * B2Y) >> Y_shift);

            rgb += 3;
            ptr++;
        }

        rgb += wgap;
    }

    return 0;
}